

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerDelFld
          (Lowerer *this,Instr *delFldInstr,JnHelperMethod helperMethod,bool useInlineCache,
          bool strictMode)

{
  IntConstOpnd *opndArg;
  Instr *pIVar1;
  undefined7 in_register_00000081;
  
  opndArg = IR::IntConstOpnd::New
                      (CONCAT71(in_register_00000081,strictMode) & 0xffffffff,TyInt32,this->m_func,
                       true);
  pIVar1 = LowererMD::LoadHelperArgument(&this->m_lowererMD,delFldInstr,&opndArg->super_Opnd);
  LowerLdFld(this,delFldInstr,helperMethod,helperMethod,useInlineCache,(LabelInstr *)0x0,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerDelFld(IR::Instr *delFldInstr, IR::JnHelperMethod helperMethod, bool useInlineCache, bool strictMode)
{
    IR::Instr *instrPrev;

    Js::PropertyOperationFlags propertyOperationFlag = Js::PropertyOperation_None;

    if (strictMode)
    {
        propertyOperationFlag = Js::PropertyOperation_StrictMode;
    }

    instrPrev = m_lowererMD.LoadHelperArgument(delFldInstr, IR::IntConstOpnd::New((IntConstType)propertyOperationFlag, TyInt32, m_func, true));

    LowerLdFld(delFldInstr, helperMethod, helperMethod, useInlineCache);

    return instrPrev;
}